

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
Liby::http::HttpServer::HttpServer
          (HttpServer *this,string *root,shared_ptr<Liby::TcpServer> *server)

{
  element_type *peVar1;
  anon_class_8_1_8991fb9c local_a8;
  ConnCallback local_a0;
  anon_class_8_1_8991fb9c local_80;
  ConnCallback local_78;
  anon_class_8_1_8991fb9c local_48;
  ConnCallback local_40;
  shared_ptr<Liby::TcpServer> *local_20;
  shared_ptr<Liby::TcpServer> *server_local;
  string *root_local;
  HttpServer *this_local;
  
  local_20 = server;
  server_local = (shared_ptr<Liby::TcpServer> *)root;
  root_local = &this->root_;
  std::__cxx11::string::string((string *)this,(string *)root);
  std::shared_ptr<Liby::TcpServer>::shared_ptr(&this->http_server_,local_20);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_server_);
  local_48.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::http::HttpServer::HttpServer(std::__cxx11::string_const&,std::shared_ptr<Liby::TcpServer>const&)::__0,void>
            ((function<void(Liby::Connection&)> *)&local_40,&local_48);
  TcpServer::onRead(peVar1,&local_40);
  std::function<void_(Liby::Connection_&)>::~function(&local_40);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_server_);
  local_80.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::http::HttpServer::HttpServer(std::__cxx11::string_const&,std::shared_ptr<Liby::TcpServer>const&)::__1,void>
            ((function<void(Liby::Connection&)> *)&local_78,&local_80);
  TcpServer::onAccept(peVar1,&local_78);
  std::function<void_(Liby::Connection_&)>::~function(&local_78);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_server_);
  local_a8.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::http::HttpServer::HttpServer(std::__cxx11::string_const&,std::shared_ptr<Liby::TcpServer>const&)::__2,void>
            ((function<void(Liby::Connection&)> *)&local_a0,&local_a8);
  TcpServer::onErro(peVar1,&local_a0);
  std::function<void_(Liby::Connection_&)>::~function(&local_a0);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_server_);
  TcpServer::start(peVar1);
  return;
}

Assistant:

HttpServer::HttpServer(const std::string &root,
                       const std::shared_ptr<TcpServer> &server)
    : root_(root), http_server_(server) {
    http_server_->onRead([this](Connection &conn) { handleReadEvent(conn); });
    http_server_->onAccept(
        [this](Connection &conn) { handleAcceptEvent(conn); });
    http_server_->onErro([this](Connection &conn) { handleErroEvent(conn); });
    http_server_->start();
}